

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

_Bool X86_insn_reg_intel2(uint id,x86_reg *reg1,x86_reg *reg2)

{
  insn_reg2 *piVar1;
  x86_reg xVar2;
  ulong uVar3;
  insn_reg2 *piVar4;
  _Bool _Var5;
  
  if (id == 0x37f) {
    piVar4 = insn_regs_intel2;
    _Var5 = true;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    piVar4 = insn_regs_intel2;
    do {
      if (uVar3 == 4) {
        return false;
      }
      piVar1 = piVar4 + 1;
      piVar4 = piVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (piVar1->insn != id);
    _Var5 = uVar3 < 5;
  }
  xVar2 = piVar4->reg2;
  *reg1 = piVar4->reg1;
  *reg2 = xVar2;
  return _Var5;
}

Assistant:

bool X86_insn_reg_intel2(unsigned int id, x86_reg *reg1, x86_reg *reg2)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel2); i++) {
		if (insn_regs_intel2[i].insn == id) {
			*reg1 = insn_regs_intel2[i].reg1;
			*reg2 = insn_regs_intel2[i].reg2;
			return true;
		}
	}

	// not found
	return false;
}